

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O3

_Bool Thumb_getInstruction
                (csh ud,uint8_t *code,size_t code_len,MCInst *instr,uint16_t *size,uint64_t address,
                void *info)

{
  uint8_t *puVar1;
  cs_detail *__s;
  uint16_t insn;
  DecodeStatus DVar2;
  uint uVar3;
  MCOperand *pMVar4;
  int64_t iVar5;
  int64_t iVar6;
  sbyte sVar7;
  long lVar8;
  MCRegisterInfo *MRI;
  int iVar9;
  uint32_t insn_00;
  
  iVar9 = (int)address;
  if (code_len < 2) {
    return false;
  }
  __s = instr->flat_insn->detail;
  MRI = (MCRegisterInfo *)size;
  if (__s != (cs_detail *)0x0) {
    lVar8 = 0;
    memset(__s,0,0x740);
    do {
      puVar1 = instr->flat_insn->detail->groups + lVar8 + 0x35;
      puVar1[0] = 0xff;
      puVar1[1] = 0xff;
      puVar1[2] = 0xff;
      puVar1[3] = 0xff;
      instr->flat_insn->detail->groups[lVar8 + 0x5f] = 0xff;
      lVar8 = lVar8 + 0x30;
    } while (lVar8 != 0x6c0);
  }
  if ((int)*(uint *)(ud + 4) < 0) {
    insn = *(ushort *)code << 8 | *(ushort *)code >> 8;
  }
  else {
    insn = *(uint16_t *)code;
  }
  DVar2 = decodeInstruction_2("\x01\f\x04\x02",instr,insn,(ulong)*(uint *)(ud + 4),MRI,iVar9);
  if (DVar2 == MCDisassembler_Fail) {
    MCInst_clear(instr);
    DVar2 = decodeInstruction_2("\x01\v\x05\x02",instr,insn,(ulong)*(uint *)(ud + 4),MRI,iVar9);
    if (DVar2 == MCDisassembler_Fail) {
      MCInst_clear(instr);
      DVar2 = decodeInstruction_2(DecoderTableThumb216,instr,insn,(ulong)*(uint *)(ud + 4),MRI,iVar9
                                 );
      if (DVar2 != MCDisassembler_Fail) {
        *size = 2;
        uVar3 = MCInst_getOpcode(instr);
        if ((uVar3 == 0x92b) && (*(int *)(ud + 0x5c) != 0)) {
          return true;
        }
        AddThumbPredicate((cs_struct *)ud,instr);
        uVar3 = MCInst_getOpcode(instr);
        if (uVar3 == 0x92b) {
          pMVar4 = MCInst_getOperand(instr,0);
          iVar5 = MCOperand_getImm(pMVar4);
          pMVar4 = MCInst_getOperand(instr,1);
          iVar6 = MCOperand_getImm(pMVar4);
          ITStatus_setITState((ARM_ITStatus *)(ud + 0x54),(char)iVar5,(char)iVar6);
          return true;
        }
        return true;
      }
      if (code_len < 4) {
        return false;
      }
      if (*(int *)(ud + 4) < 0) {
        uVar3 = (uint)CONCAT12(code[1],*(ushort *)(code + 2) << 8 | *(ushort *)(code + 2) >> 8);
        sVar7 = 0x18;
      }
      else {
        uVar3 = (uint)code[1] << 0x18 | (uint)*(ushort *)(code + 2);
        sVar7 = 0x10;
      }
      uVar3 = ((uint)*code << sVar7) + uVar3;
      MCInst_clear(instr);
      DVar2 = decodeInstruction_4("\x01\f\x01\x02",instr,uVar3,(ulong)*(uint *)(ud + 4),MRI,iVar9);
      if (DVar2 == MCDisassembler_Fail) {
        MCInst_clear(instr);
        DVar2 = decodeInstruction_4("\x01\x1b\x05\x02\x1d\x19\b\x01\x18\x03\x02",instr,uVar3,
                                    (ulong)*(uint *)(ud + 4),MRI,iVar9);
        if (DVar2 == MCDisassembler_Fail) {
          if ((uVar3 & 0xf0000000) == 0xe0000000) {
            MCInst_clear(instr);
            DVar2 = decodeInstruction_4("\x01\x14\x02\x02",instr,uVar3,(ulong)*(uint *)(ud + 4),MRI,
                                        iVar9);
            if (DVar2 != MCDisassembler_Fail) {
              *size = 4;
              UpdateThumbVFPPredicate((cs_struct *)ud,instr);
              return true;
            }
          }
          MCInst_clear(instr);
          DVar2 = decodeInstruction_4("\x01\x14\x02\x02",instr,uVar3,(ulong)*(uint *)(ud + 4),MRI,
                                      iVar9);
          if (DVar2 != MCDisassembler_Fail) goto LAB_001dbaa6;
          if ((uVar3 & 0xf0000000) == 0xe0000000) {
            MCInst_clear(instr);
            DVar2 = decodeInstruction_4("\x01\x16\x06\x028i",instr,uVar3,(ulong)*(uint *)(ud + 4),
                                        MRI,iVar9);
            if (DVar2 != MCDisassembler_Fail) goto LAB_001dba30;
          }
          if ((uVar3 & 0xff000000) == 0xf9000000) {
            MCInst_clear(instr);
            DVar2 = decodeInstruction_4("\x01\b\x04\x02",instr,uVar3 & 0xf0ffffff | 0x4000000,
                                        (ulong)*(uint *)(ud + 4),MRI,iVar9);
            if (DVar2 != MCDisassembler_Fail) goto LAB_001dba30;
          }
          if ((~uVar3 & 0xf000000) == 0) {
            MCInst_clear(instr);
            insn_00 = (uVar3 & 0xe0ffffff) + (uVar3 >> 4 & 0x1000000) + 0x12000000;
            DVar2 = decodeInstruction_4("\x01\x04\x01\x02",instr,insn_00,(ulong)*(uint *)(ud + 4),
                                        MRI,iVar9);
            if (DVar2 != MCDisassembler_Fail) goto LAB_001dba30;
          }
          else {
            insn_00 = (uVar3 & 0xe0ffffff) + (uVar3 >> 4 & 0x1000000) + 0x12000000;
          }
          MCInst_clear(instr);
          DVar2 = decodeInstruction_4("\x01\x14\x02\x02",instr,insn_00,(ulong)*(uint *)(ud + 4),MRI,
                                      iVar9);
          if (DVar2 == MCDisassembler_Fail) {
            MCInst_clear(instr);
            DVar2 = decodeInstruction_4("\x01\b\x04\x02",instr,uVar3 & 0xf3ffffff,
                                        (ulong)*(uint *)(ud + 4),MRI,iVar9);
            if (DVar2 == MCDisassembler_Fail) {
              MCInst_clear(instr);
              *size = 0;
              return false;
            }
          }
LAB_001dbaa6:
          *size = 4;
          return true;
        }
LAB_001dba30:
        *size = 4;
        goto LAB_001db88d;
      }
      *size = 4;
    }
    else {
      *size = 2;
    }
    iVar9 = *(int *)(ud + 0x5c);
    AddThumbPredicate((cs_struct *)ud,instr);
    AddThumb1SBit(instr,iVar9 != 0);
  }
  else {
    *size = 2;
LAB_001db88d:
    AddThumbPredicate((cs_struct *)ud,instr);
  }
  return true;
}

Assistant:

static DecodeStatus _Thumb_getInstruction(cs_struct *ud, MCInst *MI, const uint8_t *code, size_t code_len,
		uint16_t *Size, uint64_t Address)
{
	uint16_t insn16;
	DecodeStatus result;
	bool InITBlock;
	unsigned Firstcond, Mask; 
	uint32_t NEONLdStInsn, insn32, NEONDataInsn, NEONCryptoInsn, NEONv8Insn;
	size_t i;

	// We want to read exactly 2 bytes of data.
	if (code_len < 2)
		// not enough data
		return MCDisassembler_Fail;

	if (MI->flat_insn->detail) {
		memset(MI->flat_insn->detail, 0, offsetof(cs_detail, arm)+sizeof(cs_arm));
		for (i = 0; i < ARR_SIZE(MI->flat_insn->detail->arm.operands); i++) {
			MI->flat_insn->detail->arm.operands[i].vector_index = -1;
			MI->flat_insn->detail->arm.operands[i].neon_lane = -1;
		}
	}

	if (MODE_IS_BIG_ENDIAN(ud->mode))
		insn16 = (code[0] << 8) | code[1];
	else
		insn16 = (code[1] << 8) | code[0];

	result = decodeInstruction_2(DecoderTableThumb16, MI, insn16, Address, NULL, ud->mode);
	if (result != MCDisassembler_Fail) {
		*Size = 2;
		Check(&result, AddThumbPredicate(ud, MI));
		return result;
	}

	MCInst_clear(MI);
	result = decodeInstruction_2(DecoderTableThumbSBit16, MI, insn16, Address, NULL, ud->mode);
	if (result) {
		*Size = 2;
		InITBlock = ITStatus_instrInITBlock(&(ud->ITBlock));
		Check(&result, AddThumbPredicate(ud, MI));
		AddThumb1SBit(MI, InITBlock);
		return result;
	}

	MCInst_clear(MI);
	result = decodeInstruction_2(DecoderTableThumb216, MI, insn16, Address, NULL, ud->mode);
	if (result != MCDisassembler_Fail) {
		*Size = 2;

		// Nested IT blocks are UNPREDICTABLE.  Must be checked before we add
		// the Thumb predicate.
		if (MCInst_getOpcode(MI) == ARM_t2IT && ITStatus_instrInITBlock(&(ud->ITBlock)))
			return MCDisassembler_SoftFail;
		Check(&result, AddThumbPredicate(ud, MI));

		// If we find an IT instruction, we need to parse its condition
		// code and mask operands so that we can apply them correctly
		// to the subsequent instructions.
		if (MCInst_getOpcode(MI) == ARM_t2IT) {

			Firstcond = (unsigned int)MCOperand_getImm(MCInst_getOperand(MI, 0));
			Mask = (unsigned int)MCOperand_getImm(MCInst_getOperand(MI, 1));
			ITStatus_setITState(&(ud->ITBlock), (char)Firstcond, (char)Mask);
		}

		return result;
	}

	// We want to read exactly 4 bytes of data.
	if (code_len < 4)
		// not enough data
		return MCDisassembler_Fail;

	if (MODE_IS_BIG_ENDIAN(ud->mode))
		insn32 = (code[3] <<  0) |
			(code[2] <<  8) |
			(code[1] << 16) |
			((uint32_t) code[0] << 24);
	else
		insn32 = (code[3] <<  8) |
			(code[2] <<  0) |
			((uint32_t) code[1] << 24) |
			(code[0] << 16);

	MCInst_clear(MI);
	result = decodeInstruction_4(DecoderTableThumb32, MI, insn32, Address, NULL, ud->mode);
	if (result != MCDisassembler_Fail) {
		*Size = 4;
		InITBlock = ITStatus_instrInITBlock(&(ud->ITBlock));
		Check(&result, AddThumbPredicate(ud, MI));
		AddThumb1SBit(MI, InITBlock);
		return result;
	}

	MCInst_clear(MI);
	result = decodeInstruction_4(DecoderTableThumb232, MI, insn32, Address, NULL, ud->mode);
	if (result != MCDisassembler_Fail) {
		*Size = 4;
		Check(&result, AddThumbPredicate(ud, MI));
		return result;
	}

	if (fieldFromInstruction_4(insn32, 28, 4) == 0xE) {
		MCInst_clear(MI);
		result = decodeInstruction_4(DecoderTableVFP32, MI, insn32, Address, NULL, ud->mode);
		if (result != MCDisassembler_Fail) {
			*Size = 4;
			UpdateThumbVFPPredicate(ud, MI);
			return result;
		}
	}

	MCInst_clear(MI);
	result = decodeInstruction_4(DecoderTableVFPV832, MI, insn32, Address, NULL, ud->mode);
	if (result != MCDisassembler_Fail) {
		*Size = 4;
		return result;
	}

	if (fieldFromInstruction_4(insn32, 28, 4) == 0xE) {
		MCInst_clear(MI);
		result = decodeInstruction_4(DecoderTableNEONDup32, MI, insn32, Address, NULL, ud->mode);
		if (result != MCDisassembler_Fail) {
			*Size = 4;
			Check(&result, AddThumbPredicate(ud, MI));
			return result;
		}
	}

	if (fieldFromInstruction_4(insn32, 24, 8) == 0xF9) {
		MCInst_clear(MI);
		NEONLdStInsn = insn32;
		NEONLdStInsn &= 0xF0FFFFFF;
		NEONLdStInsn |= 0x04000000;
		result = decodeInstruction_4(DecoderTableNEONLoadStore32, MI, NEONLdStInsn, Address, NULL, ud->mode);
		if (result != MCDisassembler_Fail) {
			*Size = 4;
			Check(&result, AddThumbPredicate(ud, MI));
			return result;
		}
	}

	if (fieldFromInstruction_4(insn32, 24, 4) == 0xF) {
		MCInst_clear(MI);
		NEONDataInsn = insn32;
		NEONDataInsn &= 0xF0FFFFFF; // Clear bits 27-24
		NEONDataInsn |= (NEONDataInsn & 0x10000000) >> 4; // Move bit 28 to bit 24
		NEONDataInsn |= 0x12000000; // Set bits 28 and 25
		result = decodeInstruction_4(DecoderTableNEONData32, MI, NEONDataInsn, Address, NULL, ud->mode);
		if (result != MCDisassembler_Fail) {
			*Size = 4;
			Check(&result, AddThumbPredicate(ud, MI));
			return result;
		}
	}

	MCInst_clear(MI);
	NEONCryptoInsn = insn32;
	NEONCryptoInsn &= 0xF0FFFFFF; // Clear bits 27-24
	NEONCryptoInsn |= (NEONCryptoInsn & 0x10000000) >> 4; // Move bit 28 to bit 24
	NEONCryptoInsn |= 0x12000000; // Set bits 28 and 25
	result = decodeInstruction_4(DecoderTablev8Crypto32, MI, NEONCryptoInsn,
			Address, NULL, ud->mode);
	if (result != MCDisassembler_Fail) {
		*Size = 4;
		return result;
	}

	MCInst_clear(MI);
	NEONv8Insn = insn32;
	NEONv8Insn &= 0xF3FFFFFF; // Clear bits 27-26
	result = decodeInstruction_4(DecoderTablev8NEON32, MI, NEONv8Insn, Address, NULL, ud->mode);
	if (result != MCDisassembler_Fail) {
		*Size = 4;
		return result;
	}

	MCInst_clear(MI);
	*Size = 0;
	return MCDisassembler_Fail;
}